

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O1

Pair * __thiscall TagVecOfTags::pair(Pair *__return_storage_ptr__,TagVecOfTags *this)

{
  Configuration::Pair::Pair(__return_storage_ptr__);
  QString::operator=(&__return_storage_ptr__->m_stringValue,
                     (QString *)&(this->m_stringValue).m_value);
  __return_storage_ptr__->m_intValue = (this->m_intValue).m_value;
  return __return_storage_ptr__;
}

Assistant:

Configuration::Pair
TagVecOfTags::pair() const
{
	Configuration::Pair pair;

	pair.m_stringValue = m_stringValue.value();
	pair.m_intValue = m_intValue.value();

	return pair;
}